

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractfileengine.cpp
# Opt level: O2

QString * __thiscall
QAbstractFileEngineIterator::currentFilePath
          (QString *__return_storage_ptr__,QAbstractFileEngineIterator *this)

{
  Data *pDVar1;
  qsizetype qVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_78;
  QStringBuilder<QString,_QString_&> local_58;
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  (*this->_vptr_QAbstractFileEngineIterator[3])(&local_38);
  qVar2 = local_38.size;
  pDVar1 = local_38.d;
  if (local_38.ptr == (char16_t *)0x0) {
    local_38.d = (Data *)0x0;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    local_38.size = 0;
    (__return_storage_ptr__->d).size = qVar2;
  }
  else {
    local_58.a.d.d = (this->m_path).d.d;
    local_58.a.d.ptr = (this->m_path).d.ptr;
    local_58.a.d.size = (this->m_path).d.size;
    if (local_58.a.d.d == (Data *)0x0) {
      local_58.a.d.d = (Data *)0x0;
    }
    else {
      LOCK();
      ((local_58.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_78.d = (Data *)0x0;
    local_78.ptr = (char16_t *)0x0;
    local_78.size = 0;
    local_58.b = (QString *)&local_38;
    QStringBuilder<QString,_QString_&>::convertTo<QString>(__return_storage_ptr__,&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QAbstractFileEngineIterator::currentFilePath() const
{
    QString name = currentFileName();
    if (name.isNull())
        return name;

    return path() + name;
}